

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rbuVfsOpen(sqlite3_vfs *pVfs,char *zName,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  long lVar1;
  sqlite3rbu *psVar2;
  bool bVar3;
  int iVar4;
  rbu_file *prVar5;
  char *pcVar6;
  size_t __n;
  sqlite3_io_methods *psVar7;
  
  lVar1 = *(long *)(pVfs + 1);
  pFile->pMethods = (sqlite3_io_methods *)0x0;
  pFile[1].pMethods = (sqlite3_io_methods *)0x0;
  pFile[2].pMethods = (sqlite3_io_methods *)0x0;
  pFile[3].pMethods = (sqlite3_io_methods *)0x0;
  pFile[4].pMethods = (sqlite3_io_methods *)0x0;
  pFile[5].pMethods = (sqlite3_io_methods *)0x0;
  pFile[10].pMethods = (sqlite3_io_methods *)0x0;
  pFile[0xb].pMethods = (sqlite3_io_methods *)0x0;
  pFile[8].pMethods = (sqlite3_io_methods *)0x0;
  pFile[9].pMethods = (sqlite3_io_methods *)0x0;
  pFile[6].pMethods = (sqlite3_io_methods *)0x0;
  pFile[7].pMethods = (sqlite3_io_methods *)0x0;
  pFile[0xc].pMethods = (sqlite3_io_methods *)0x0;
  pFile[1].pMethods = (sqlite3_io_methods *)(pFile + 0xd);
  pFile[2].pMethods = (sqlite3_io_methods *)pVfs;
  *(int *)&pFile[5].pMethods = flags;
  if (zName == (char *)0x0) {
    pFile[3].pMethods = (sqlite3_io_methods *)pVfs[1].pNext;
    if (((uint)flags >> 8 & 1) != 0) goto LAB_00130aaf;
    bVar3 = true;
    zName = (char *)0x0;
  }
  else if (((uint)flags >> 8 & 1) == 0) {
    bVar3 = true;
    if ((((uint)flags >> 0x13 & 1) != 0) &&
       (prVar5 = rbuFindMaindb((rbu_vfs *)pVfs,zName,0), prVar5 != (rbu_file *)0x0)) {
      psVar2 = prVar5->pRbu;
      if ((psVar2 == (sqlite3rbu *)0x0) || (psVar2->eStage != 1)) {
        prVar5->pWalFd = (rbu_file *)pFile;
      }
      else {
        pcVar6 = zName;
        if (psVar2->zTarget == (char *)0x0) {
          pcVar6 = sqlite3_db_filename(psVar2->dbRbu,"main");
          pcVar6 = rbuMainToWal(pcVar6,0x40);
        }
        __n = strlen(pcVar6);
        iVar4 = sqlite3_initialize();
        if ((iVar4 != 0) ||
           (zName = (char *)sqlite3Malloc(__n + 2),
           (sqlite3_io_methods *)zName == (sqlite3_io_methods *)0x0)) {
          pFile[3].pMethods = (sqlite3_io_methods *)prVar5->pRbu;
          prVar5->pWalFd = (rbu_file *)pFile;
          if (*(long *)pFile[1].pMethods != 0) {
            pFile->pMethods = &rbuVfsOpen::rbuvfs_io_methods;
            return 7;
          }
          iVar4 = 7;
          goto LAB_00130b6a;
        }
        memcpy(zName,pcVar6,__n);
        *(undefined1 *)((long)zName + (__n - 3)) = 0x6f;
        *(undefined2 *)((long)&((sqlite3_io_methods *)zName)->iVersion + __n) = 0;
        pFile[8].pMethods = (sqlite3_io_methods *)zName;
        pFile[3].pMethods = (sqlite3_io_methods *)prVar5->pRbu;
        prVar5->pWalFd = (rbu_file *)pFile;
      }
    }
  }
  else {
    psVar7 = (sqlite3_io_methods *)rbuMainToWal(zName,flags);
    pFile[9].pMethods = psVar7;
LAB_00130aaf:
    bVar3 = false;
    iVar4 = sqlite3_uri_boolean(zName,"rbu_memory",0);
    if (iVar4 != 0) {
      flags = 0x21e;
      zName = (char *)0x0;
    }
  }
  iVar4 = (**(code **)(lVar1 + 0x28))(lVar1,zName,pFile[1].pMethods,flags,pOutFlags);
  if (*(long *)pFile[1].pMethods != 0) {
    pFile->pMethods = &rbuVfsOpen::rbuvfs_io_methods;
    if (bVar3) {
      return iVar4;
    }
    rbuMainlistAdd((rbu_file *)pFile);
    return iVar4;
  }
LAB_00130b6a:
  sqlite3_free(pFile[8].pMethods);
  return iVar4;
}

Assistant:

static int rbuVfsOpen(
  sqlite3_vfs *pVfs,
  const char *zName,
  sqlite3_file *pFile,
  int flags,
  int *pOutFlags
){
  static sqlite3_io_methods rbuvfs_io_methods = {
    2,                            /* iVersion */
    rbuVfsClose,                  /* xClose */
    rbuVfsRead,                   /* xRead */
    rbuVfsWrite,                  /* xWrite */
    rbuVfsTruncate,               /* xTruncate */
    rbuVfsSync,                   /* xSync */
    rbuVfsFileSize,               /* xFileSize */
    rbuVfsLock,                   /* xLock */
    rbuVfsUnlock,                 /* xUnlock */
    rbuVfsCheckReservedLock,      /* xCheckReservedLock */
    rbuVfsFileControl,            /* xFileControl */
    rbuVfsSectorSize,             /* xSectorSize */
    rbuVfsDeviceCharacteristics,  /* xDeviceCharacteristics */
    rbuVfsShmMap,                 /* xShmMap */
    rbuVfsShmLock,                /* xShmLock */
    rbuVfsShmBarrier,             /* xShmBarrier */
    rbuVfsShmUnmap,               /* xShmUnmap */
    0, 0                          /* xFetch, xUnfetch */
  };
  rbu_vfs *pRbuVfs = (rbu_vfs*)pVfs;
  sqlite3_vfs *pRealVfs = pRbuVfs->pRealVfs;
  rbu_file *pFd = (rbu_file *)pFile;
  int rc = SQLITE_OK;
  const char *zOpen = zName;
  int oflags = flags;

  memset(pFd, 0, sizeof(rbu_file));
  pFd->pReal = (sqlite3_file*)&pFd[1];
  pFd->pRbuVfs = pRbuVfs;
  pFd->openFlags = flags;
  if( zName ){
    if( flags & SQLITE_OPEN_MAIN_DB ){
      /* A main database has just been opened. The following block sets
      ** (pFd->zWal) to point to a buffer owned by SQLite that contains
      ** the name of the *-wal file this db connection will use. SQLite
      ** happens to pass a pointer to this buffer when using xAccess()
      ** or xOpen() to operate on the *-wal file.  */
      pFd->zWal = rbuMainToWal(zName, flags);
    }
    else if( flags & SQLITE_OPEN_WAL ){
      rbu_file *pDb = rbuFindMaindb(pRbuVfs, zName, 0);
      if( pDb ){
        if( pDb->pRbu && pDb->pRbu->eStage==RBU_STAGE_OAL ){
          /* This call is to open a *-wal file. Intead, open the *-oal. This
          ** code ensures that the string passed to xOpen() is terminated by a
          ** pair of '\0' bytes in case the VFS attempts to extract a URI 
          ** parameter from it.  */
          const char *zBase = zName;
          size_t nCopy;
          char *zCopy;
          if( rbuIsVacuum(pDb->pRbu) ){
            zBase = sqlite3_db_filename(pDb->pRbu->dbRbu, "main");
            zBase = rbuMainToWal(zBase, SQLITE_OPEN_URI);
          }
          nCopy = strlen(zBase);
          zCopy = sqlite3_malloc64(nCopy+2);
          if( zCopy ){
            memcpy(zCopy, zBase, nCopy);
            zCopy[nCopy-3] = 'o';
            zCopy[nCopy] = '\0';
            zCopy[nCopy+1] = '\0';
            zOpen = (const char*)(pFd->zDel = zCopy);
          }else{
            rc = SQLITE_NOMEM;
          }
          pFd->pRbu = pDb->pRbu;
        }
        pDb->pWalFd = pFd;
      }
    }
  }else{
    pFd->pRbu = pRbuVfs->pRbu;
  }

  if( oflags & SQLITE_OPEN_MAIN_DB 
   && sqlite3_uri_boolean(zName, "rbu_memory", 0) 
  ){
    assert( oflags & SQLITE_OPEN_MAIN_DB );
    oflags =  SQLITE_OPEN_TEMP_DB | SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE |
              SQLITE_OPEN_EXCLUSIVE | SQLITE_OPEN_DELETEONCLOSE;
    zOpen = 0;
  }

  if( rc==SQLITE_OK ){
    rc = pRealVfs->xOpen(pRealVfs, zOpen, pFd->pReal, oflags, pOutFlags);
  }
  if( pFd->pReal->pMethods ){
    /* The xOpen() operation has succeeded. Set the sqlite3_file.pMethods
    ** pointer and, if the file is a main database file, link it into the
    ** mutex protected linked list of all such files.  */
    pFile->pMethods = &rbuvfs_io_methods;
    if( flags & SQLITE_OPEN_MAIN_DB ){
      rbuMainlistAdd(pFd);
    }
  }else{
    sqlite3_free(pFd->zDel);
  }

  return rc;
}